

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_sentinel_task(void *arg1,void *arg2)

{
  void *p_thr;
  fio_lock_i ret;
  timespec local_28;
  
  if (fio_data->active != '\0') {
    fio_state_callback_force(FIO_CALL_BEFORE_FORK);
    LOCK();
    UNLOCK();
    local_28.tv_sec._0_1_ = fio_fork_lock;
    while ((fio_lock_i)local_28.tv_sec != '\0') {
      fio_fork_lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_28.tv_sec._0_1_ = fio_fork_lock;
    }
    fio_fork_lock = '\x01';
    p_thr = fio_thread_new(fio_sentinel_worker_thread,&fio_fork_lock);
    fio_thread_free(p_thr);
    LOCK();
    UNLOCK();
    while (fio_fork_lock != '\0') {
      fio_fork_lock = '\x01';
      local_28.tv_sec = 0;
      local_28.tv_nsec = 1;
      nanosleep(&local_28,(timespec *)0x0);
      LOCK();
      UNLOCK();
    }
    LOCK();
    fio_fork_lock = '\0';
    UNLOCK();
    local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,1);
    fio_state_callback_force(FIO_CALL_AFTER_FORK);
    fio_state_callback_force(FIO_CALL_IN_MASTER);
  }
  return;
}

Assistant:

static void fio_sentinel_task(void *arg1, void *arg2) {
  if (!fio_data->active)
    return;
  fio_state_callback_force(FIO_CALL_BEFORE_FORK);
  fio_lock(&fio_fork_lock); /* will wait for worker thread to release lock. */
  void *thrd =
      fio_thread_new(fio_sentinel_worker_thread, (void *)&fio_fork_lock);
  fio_thread_free(thrd);
  fio_lock(&fio_fork_lock);   /* will wait for worker thread to release lock. */
  fio_unlock(&fio_fork_lock); /* release lock for next fork. */
  fio_state_callback_force(FIO_CALL_AFTER_FORK);
  fio_state_callback_force(FIO_CALL_IN_MASTER);
  (void)arg1;
  (void)arg2;
}